

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

uint objgetp_end(mcmcxdef *ctx,objnum objn,prpnum prop)

{
  ushort uVar1;
  uint uVar2;
  uchar *puVar3;
  uint uVar4;
  
  uVar4 = 0;
  uVar2 = objgetp(ctx,objn,prop,(dattyp *)0x0);
  if (uVar2 != 0) {
    puVar3 = mcmlck(ctx,objn);
    uVar1 = *(ushort *)(puVar3 + (ulong)uVar2 + 3);
    mcmunlck(ctx,objn);
    uVar4 = uVar1 + uVar2 + 6;
  }
  return uVar4;
}

Assistant:

uint objgetp_end(mcmcxdef *ctx, objnum objn, prpnum prop)
{
    objdef *objp;
    prpdef *propptr;
    uint    ofs;
    uint    valsiz;
    
    /* get the start of the object */
    ofs = objgetp(ctx, objn, prop, 0);
    if (ofs == 0)
        return 0;

    /* get the object */
    objp = mcmlck(ctx, (mcmon)objn);

    /* get the property */
    propptr = objofsp(objp, ofs);

    /* get the data size */
    valsiz = prpsize(propptr);

    /* done with the object */
    mcmunlck(ctx, (mcmon)objn);

    /* 
     *   return the ending offset - it's the starting offset plus the
     *   property header size plus the size of the property data 
     */
    return ofs + PRPHDRSIZ + valsiz;
}